

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O3

float crnlib::lanczos12_filter(float t)

{
  double dVar1;
  double dVar2;
  float fVar3;
  double dVar4;
  float fVar5;
  
  fVar5 = -t;
  if (-t <= t) {
    fVar5 = t;
  }
  fVar3 = 0.0;
  if (fVar5 < 12.0) {
    dVar1 = (double)fVar5 * 3.141592653589793;
    if (0.009999999776482582 <= ABS(dVar1)) {
      dVar4 = sin(dVar1);
      dVar4 = dVar4 / dVar1;
    }
    else {
      dVar4 = ((dVar1 * dVar1) / 120.0 + -0.1666666716337204) * dVar1 * dVar1 + 1.0;
    }
    dVar1 = (double)(fVar5 / 12.0) * 3.141592653589793;
    if (0.009999999776482582 <= ABS(dVar1)) {
      dVar2 = sin(dVar1);
      dVar2 = dVar2 / dVar1;
    }
    else {
      dVar2 = ((dVar1 * dVar1) / 120.0 + -0.1666666716337204) * dVar1 * dVar1 + 1.0;
    }
    fVar3 = 0.0;
    if (1.249999968422344e-05 <= ABS(dVar4 * dVar2)) {
      fVar3 = (float)(dVar4 * dVar2);
    }
  }
  return fVar3;
}

Assistant:

static float lanczos12_filter(float t)
    {
        if (t < 0.0f)
        {
            t = -t;
        }

        if (t < 12.0f)
        {
            return clean(sinc(t) * sinc(t / 12.0f));
        }
        else
        {
            return (0.0f);
        }
    }